

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O3

void process_args(int argc,char **argv)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  long *plVar5;
  int iVar6;
  size_t sVar7;
  int *piVar8;
  size_type sVar9;
  ostream *poVar10;
  _Alloc_hider _Var11;
  long lVar12;
  char *pcVar13;
  int option_index;
  option long_options [11];
  allocator<char> local_1c5;
  undefined4 local_1c4;
  long *local_1c0 [2];
  long local_1b0 [2];
  long *local_1a0;
  undefined1 local_198 [360];
  
  memcpy(local_198,&PTR_anon_var_dwarf_a647_001be330,0x160);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  pcVar13 = *argv;
  if (pcVar13 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1ec378);
  }
  else {
    sVar7 = strlen(pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [arguments]",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"valid arguments:",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-a --inputdirfg sets the input directory for foreground frames",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-b --inputdirbg sets the input directory for background frames",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-o --outputdir sets the directory for output frames",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-s --shader sets the filename of the fragment shader",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-f --filetype sets the filetype (only tested with png so far)",
             0x3d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-n --numframes sets the number of frames to store in memory at once",0x43);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t(defaults to 8)",0x10)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-d --delay sets the delay for processed_older frame, only affects some filters",0x4e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t(defaults to 1)",0x10)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-w --width sets the frame width in pixels",0x29);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-h --height sets the frame height in pixels",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t(defaults to 1280x720)",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-c --swap swaps the foreground/background inputs to the shader",
             0x3e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "-p --preview run in preview mode, don\'t save images just play the effect",0x48);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_1c4 = 0;
LAB_0010bfb8:
  while (iVar6 = getopt_long(argc,argv,"a:b:o:s:f:n:d:w:h:cp",local_198,&local_1c4),
        pcVar13 = _optarg, sVar4 = frag_path_abi_cxx11_._M_string_length,
        sVar3 = out_filetype_abi_cxx11_._M_string_length,
        sVar2 = output_dir_abi_cxx11_._M_string_length,
        sVar1 = input_dir_bg_abi_cxx11_._M_string_length,
        sVar9 = input_dir_fg_abi_cxx11_._M_string_length, iVar6 < 0x61) {
    if (iVar6 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"idk what this means, something\'s funny with ",0x2c);
      lVar12 = 8;
      pcVar13 = " ur args";
      goto LAB_0010c440;
    }
    if (iVar6 != 0x3f) {
      if (iVar6 == -1) {
        return;
      }
switchD_0010bfe9_caseD_65:
      abort();
    }
  }
  switch(iVar6) {
  case 0x61:
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1c13e0,0,(char *)sVar9,(ulong)pcVar13);
    if (input_dir_fg_abi_cxx11_._M_dataplus._M_p[input_dir_fg_abi_cxx11_._M_string_length - 1] !=
        '/') goto LAB_0010c51b;
    goto LAB_0010bfb8;
  case 0x62:
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1c1400,0,(char *)sVar1,(ulong)pcVar13);
    sVar9 = input_dir_bg_abi_cxx11_._M_string_length;
    _Var11 = input_dir_bg_abi_cxx11_._M_dataplus;
    break;
  case 99:
    swap_fg_bg = true;
    lVar12 = 0x22;
    pcVar13 = "swapping foreground and background";
    goto LAB_0010c440;
  case 100:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,_optarg,&local_1c5);
    plVar5 = local_1c0[0];
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar12 = strtol((char *)plVar5,(char **)&local_1a0,10);
    if (local_1a0 == plVar5) goto LAB_0010c4b7;
    if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar8 == 0x22)) {
      std::__throw_out_of_range("stoi");
LAB_0010c4eb:
      std::__throw_invalid_argument("stoi");
      goto LAB_0010c4f7;
    }
    if (*piVar8 == 0) {
      *piVar8 = iVar6;
    }
    num_frames_back = (uint)lVar12;
LAB_0010c3f0:
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    goto LAB_0010bfb8;
  default:
    goto switchD_0010bfe9_caseD_65;
  case 0x66:
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1c1440,0,(char *)sVar3,(ulong)pcVar13);
    pcVar13 = _optarg;
    sVar9 = in_filetype_abi_cxx11_._M_string_length;
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1c1460,0,(char *)sVar9,(ulong)pcVar13);
    goto LAB_0010bfb8;
  case 0x68:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,_optarg,&local_1c5);
    plVar5 = local_1c0[0];
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar12 = strtol((char *)plVar5,(char **)&local_1a0,10);
    if (local_1a0 == plVar5) goto LAB_0010c503;
    if ((0xfffffffeffffffff < lVar12 - 0x80000000U) && (*piVar8 != 0x22)) {
      if (*piVar8 == 0) {
        *piVar8 = iVar6;
      }
      res.y = (float)(int)lVar12;
      goto LAB_0010c3f0;
    }
    goto LAB_0010c50f;
  case 0x6e:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,_optarg,&local_1c5);
    plVar5 = local_1c0[0];
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar12 = strtol((char *)plVar5,(char **)&local_1a0,10);
    if (local_1a0 != plVar5) {
      if ((0xfffffffeffffffff < lVar12 - 0x80000000U) && (*piVar8 != 0x22)) {
        if (*piVar8 == 0) {
          *piVar8 = iVar6;
        }
        batch_size = (uint)lVar12;
        goto LAB_0010c3f0;
      }
      std::__throw_out_of_range("stoi");
LAB_0010c4b7:
      std::__throw_invalid_argument("stoi");
      goto LAB_0010c4c3;
    }
    std::__throw_invalid_argument("stoi");
    goto switchD_0010bfe9_caseD_65;
  case 0x6f:
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1c1420,0,(char *)sVar2,(ulong)pcVar13);
    sVar9 = output_dir_abi_cxx11_._M_string_length;
    _Var11 = output_dir_abi_cxx11_._M_dataplus;
    break;
  case 0x70:
    preview_mode = true;
    lVar12 = 0x2a;
    pcVar13 = "running in preview mode - no saving images";
LAB_0010c440:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar13,lVar12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    goto LAB_0010bfb8;
  case 0x73:
    strlen(_optarg);
    std::__cxx11::string::_M_replace(0x1c1480,0,(char *)sVar4,(ulong)pcVar13);
    if (frag_path_abi_cxx11_._M_dataplus._M_p[frag_path_abi_cxx11_._M_string_length - 1] == '/') {
LAB_0010c4c3:
      poVar10 = std::operator<<((ostream *)&std::cout,"u specified a directory, ");
      pcVar13 = "pls specify the frag shader filename instead";
      goto LAB_0010c535;
    }
    goto LAB_0010bfb8;
  case 0x77:
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1c0,_optarg,&local_1c5);
    plVar5 = local_1c0[0];
    piVar8 = __errno_location();
    iVar6 = *piVar8;
    *piVar8 = 0;
    lVar12 = strtol((char *)plVar5,(char **)&local_1a0,10);
    if (local_1a0 == plVar5) goto LAB_0010c4eb;
    if ((0xfffffffeffffffff < lVar12 - 0x80000000U) && (*piVar8 != 0x22)) {
      if (*piVar8 == 0) {
        *piVar8 = iVar6;
      }
      res.x = (float)(int)lVar12;
      goto LAB_0010c3f0;
    }
LAB_0010c4f7:
    std::__throw_out_of_range("stoi");
LAB_0010c503:
    std::__throw_invalid_argument("stoi");
LAB_0010c50f:
    std::__throw_out_of_range("stoi");
LAB_0010c51b:
    poVar10 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory.");
    pcVar13 = " pls try again";
    goto LAB_0010c535;
  }
  if (_Var11._M_p[sVar9 - 1] != '/') {
    poVar10 = std::operator<<((ostream *)&std::cout,"u specified a file, not a directory. ");
    pcVar13 = "pls try again";
LAB_0010c535:
    poVar10 = std::operator<<(poVar10,pcVar13);
    std::endl<char,std::char_traits<char>>(poVar10);
    abort();
  }
  goto LAB_0010bfb8;
}

Assistant:

void process_args(int argc, char* argv[]) {
	struct option long_options[] = {
		/* These options don’t set a flag.
		 We distinguish them by their indices. */
		{"inputdirfg", required_argument, 0, 'a'},
		{"inputdirbg", required_argument, 0, 'b'},
		{"outputdir", required_argument, 0, 'o'},
		{"shader", required_argument, 0, 's'},
		{"filetype", required_argument, 0, 'f'},
		{"numframes", required_argument, 0, 'n'},
		{"delay", required_argument, 0, 'd'},
		{"width", required_argument, 0, 'w'},
		{"height", required_argument, 0, 'h'},
		{"swap", no_argument, 0, 'c'},
		{"preview", no_argument, 0, 'p'}
	};

	std::cout << "Usage: " << argv[0] << " [arguments]" << std::endl;
	std::cout << "valid arguments:" << std::endl;
	std::cout << "-a --inputdirfg sets the input directory for foreground frames" << std::endl;
	std::cout << "-b --inputdirbg sets the input directory for background frames" << std::endl;
	std::cout << "-o --outputdir sets the directory for output frames" << std::endl;
	std::cout << "-s --shader sets the filename of the fragment shader" << std::endl;
	std::cout << "-f --filetype sets the filetype (only tested with png so far)" << std::endl;
	std::cout << "-n --numframes sets the number of frames to store in memory at once" << std::endl;
	std::cout << "\t(defaults to 8)" << std::endl;
	std::cout << "-d --delay sets the delay for processed_older frame, only affects some filters" << std::endl;
	std::cout << "\t(defaults to 1)" << std::endl;
	std::cout << "-w --width sets the frame width in pixels" << std::endl;
	std::cout << "-h --height sets the frame height in pixels" << std::endl;
	std::cout << "\t(defaults to 1280x720)" << std::endl;
	std::cout << "-c --swap swaps the foreground/background inputs to the shader" << std::endl;
	std::cout << "-p --preview run in preview mode, don't save images just play the effect" << std::endl;

	/* getopt_long stores the option index here. */
	int option_index = 0;
	int c;
	while (
		(c = getopt_long(
			argc,
			argv,
			"a:b:o:s:f:n:d:w:h:cp",
			long_options,
			&option_index)
		) != -1)
	{
		switch (c) {
			case 0:
				std::cout << "idk what this means, something's funny with "
					<< " ur args" << std::endl;
				break;
			case 'a':
				input_dir_fg = optarg;
				if (input_dir_fg[input_dir_fg.size()-1] != '/') {
					std::cout << "u specified a file, not a directory."
						<< " pls try again" << std::endl;
					abort();
				}
				break;
			case 'b':
				input_dir_bg = optarg;
				if (input_dir_bg[input_dir_bg.size()-1] != '/') {
					std::cout << "u specified a file, not a directory. "
						<< "pls try again" << std::endl;
					abort();
				}
				break;
			case 'o':
				output_dir = optarg;
				if (output_dir[output_dir.size()-1] != '/') {
					std::cout << "u specified a file, not a directory. "
						<< "pls try again" << std::endl;
					abort();
				}
				break;
			case 's':
				frag_path = optarg;
				if (frag_path[frag_path.size()-1] == '/') {
					std::cout << "u specified a directory, "
						<< "pls specify the frag shader filename instead"
						<< std::endl;
					abort();
				}
				break;
			case 'f':
				out_filetype = optarg;
				in_filetype = optarg;
				break;
			case 'n':
				batch_size = std::stoi(optarg);
				break;
			case 'd':
				num_frames_back = std::stoi(optarg);
				break;
			case 'w':
				res.x = std::stoi(optarg);
				break;
			case 'h':
				res.y = std::stoi(optarg);
				break;
			case 'c':
				swap_fg_bg = true;
				std::cout << "swapping foreground and background" << std::endl;
				break;
			case 'p':
				preview_mode = true;
				std::cout << "running in preview mode - no saving images"
					<< std::endl;
				break;
			case '?':
			  break;

			default:
			  abort ();
		}
	}
}